

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

Error asmjit::v1_14::Formatter::formatInstruction
                (String *sb,FormatFlags formatFlags,BaseEmitter *emitter,Arch arch,BaseInst *inst,
                Operand_ *operands,size_t opCount)

{
  char in_CL;
  Operand_ *in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  FormatFlags unaff_retaddr;
  String *in_stack_00000008;
  Operand_ *in_stack_00000088;
  BaseInst *in_stack_00000090;
  Arch in_stack_0000009f;
  BaseEmitter *in_stack_000000a0;
  FormatFlags in_stack_000000ac;
  String *in_stack_000000b0;
  size_t in_stack_00000560;
  bool local_3a;
  bool local_39;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  Error EVar1;
  undefined1 in_stack_fffffffffffffffc;
  
  local_39 = in_CL == '\x01' || in_CL == '\x02';
  if (local_39) {
    EVar1 = x86::FormatterInternal::formatInstruction
                      (in_stack_000000b0,in_stack_000000ac,in_stack_000000a0,in_stack_0000009f,
                       in_stack_00000090,in_stack_00000088,in_stack_00000560);
  }
  else {
    local_3a = in_CL == '\x06' || in_CL == '\f';
    if (local_3a) {
      EVar1 = a64::FormatterInternal::formatInstruction
                        (in_stack_00000008,unaff_retaddr,
                         (BaseEmitter *)
                         CONCAT17(in_CL,CONCAT16(in_CL,CONCAT15(in_CL,CONCAT14(
                                                  in_stack_fffffffffffffffc,
                                                  in_stack_fffffffffffffff8)))),
                         (Arch)((ulong)in_RDI >> 0x38),
                         (BaseInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                         (size_t)in_stack_000000a0);
    }
    else {
      EVar1 = 4;
    }
  }
  return EVar1;
}

Assistant:

Error formatInstruction(
  String& sb,
  FormatFlags formatFlags,
  const BaseEmitter* emitter,
  Arch arch,
  const BaseInst& inst, const Operand_* operands, size_t opCount) noexcept {

#if !defined(ASMJIT_NO_X86)
  if (Environment::isFamilyX86(arch))
    return x86::FormatterInternal::formatInstruction(sb, formatFlags, emitter, arch, inst, operands, opCount);
#endif

#if !defined(ASMJIT_NO_AARCH64)
  if (Environment::isFamilyAArch64(arch))
    return a64::FormatterInternal::formatInstruction(sb, formatFlags, emitter, arch, inst, operands, opCount);
#endif

  return kErrorInvalidArch;
}